

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  fpclass_type *pfVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  byte bVar10;
  long lVar11;
  int32_t *piVar12;
  int *piVar13;
  long lVar14;
  int *piVar15;
  cpp_dec_float<100U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_1a8;
  int *local_158;
  int *local_150;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_148;
  cpp_dec_float<100U,_int,_void> *local_140;
  cpp_dec_float<100U,_int,_void> local_138;
  pointer local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  uint uStack_b0;
  uint local_ac;
  uint uStack_a8;
  undefined8 uStack_a4;
  uint *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  uStack_a8 = 0;
  uStack_a4 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  local_ac = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  local_150 = p_idx;
  local_e0 = p_work;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1a8,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_88,&local_1a8,&p_work[p_col].m_backend);
  local_138.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
  local_138.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
  local_138.data._M_elems[0] = local_88.data._M_elems[0];
  local_138.data._M_elems[1] = local_88.data._M_elems[1];
  local_138.data._M_elems[2] = local_88.data._M_elems[2];
  local_138.data._M_elems[3] = local_88.data._M_elems[3];
  local_138.data._M_elems[4] = local_88.data._M_elems[4];
  local_138.data._M_elems[5] = local_88.data._M_elems[5];
  local_138.data._M_elems[6] = local_88.data._M_elems[6];
  local_138.data._M_elems[7] = local_88.data._M_elems[7];
  local_138.data._M_elems[8] = local_88.data._M_elems[8];
  local_138.data._M_elems[9] = local_88.data._M_elems[9];
  local_138.data._M_elems[10] = local_88.data._M_elems[10];
  local_138.data._M_elems[0xb] = local_88.data._M_elems[0xb];
  local_138.data._M_elems[0xc] = local_88.data._M_elems[0xc];
  local_138.data._M_elems[0xd] = local_88.data._M_elems[0xd];
  local_138.exp = local_88.exp;
  local_138.neg = local_88.neg;
  local_138.fpclass = local_88.fpclass;
  local_138.prec_elem = local_88.prec_elem;
  iVar6 = makeLvec(this,num,p_col);
  piVar15 = local_150;
  local_e8 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_158 = (this->l).idx;
  iVar7 = local_150[(long)num + -1];
  local_148 = this;
  if (iVar7 != p_col) {
    local_140 = (cpp_dec_float<100U,_int,_void> *)CONCAT44(local_140._4_4_,iVar6);
    piVar13 = local_158 + iVar6;
    pfVar8 = &local_e8[iVar6].m_backend.fpclass;
    lVar14 = 0;
    do {
      *piVar13 = iVar7;
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 0x10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems[6] = 0;
      local_1a8.data._M_elems[7] = 0;
      local_1a8.data._M_elems[8] = 0;
      local_1a8.data._M_elems[9] = 0;
      local_1a8.data._M_elems[10] = 0;
      local_1a8.data._M_elems[0xb] = 0;
      local_1a8.data._M_elems[0xc] = 0;
      local_1a8.data._M_elems[0xd] = 0;
      local_1a8.data._M_elems._56_5_ = 0;
      local_1a8.data._M_elems[0xf]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      pcVar9 = &local_138;
      if (&local_1a8 != &local_e0[iVar7].m_backend) {
        local_1a8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
        local_1a8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
        local_1a8.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
        local_1a8.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
        local_1a8.data._M_elems[8] = local_138.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_138.data._M_elems[9];
        local_1a8.data._M_elems[10] = local_138.data._M_elems[10];
        local_1a8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
        local_1a8.data._M_elems[4] = local_138.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_138.data._M_elems[5];
        local_1a8.data._M_elems[6] = local_138.data._M_elems[6];
        local_1a8.data._M_elems[7] = local_138.data._M_elems[7];
        local_1a8.data._M_elems[0] = local_138.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_138.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_138.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_138.data._M_elems[3];
        local_1a8.exp = local_138.exp;
        local_1a8.neg = local_138.neg;
        local_1a8.fpclass = local_138.fpclass;
        local_1a8.prec_elem = local_138.prec_elem;
        pcVar9 = &local_e0[iVar7].m_backend;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_1a8,pcVar9)
      ;
      *(ulong *)(((cpp_dec_float<100U,_int,_void> *)(pfVar8 + -0x12))->data)._M_elems =
           CONCAT44(local_1a8.data._M_elems[1],local_1a8.data._M_elems[0]);
      *(ulong *)(pfVar8 + -0x10) = CONCAT44(local_1a8.data._M_elems[3],local_1a8.data._M_elems[2]);
      *(ulong *)(pfVar8 + -0xe) = CONCAT44(local_1a8.data._M_elems[5],local_1a8.data._M_elems[4]);
      *(ulong *)(pfVar8 + -0xc) = CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]);
      *(ulong *)(pfVar8 + -10) = CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]);
      *(ulong *)(pfVar8 + -8) = CONCAT44(local_1a8.data._M_elems[0xb],local_1a8.data._M_elems[10]);
      *(ulong *)(pfVar8 + -6) = CONCAT44(local_1a8.data._M_elems[0xd],local_1a8.data._M_elems[0xc]);
      *(ulong *)(pfVar8 + -4) =
           CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
      pfVar8[-2] = local_1a8.exp;
      *(bool *)(pfVar8 + -1) = local_1a8.neg;
      *(undefined8 *)pfVar8 = local_1a8._72_8_;
      iVar7 = piVar15[(long)num + lVar14 + -2];
      piVar13 = piVar13 + 1;
      pfVar8 = pfVar8 + 0x14;
      lVar14 = lVar14 + -1;
    } while (iVar7 != p_col);
    iVar6 = (int)local_140 - (int)lVar14;
    num = num + (int)lVar14;
  }
  lVar14 = (long)iVar6;
  local_158[lVar14] = p_col;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1a8,1,(type *)0x0);
  local_88.data._M_elems[0xc] = local_138.data._M_elems[0xc];
  local_88.data._M_elems[0xd] = local_138.data._M_elems[0xd];
  local_88.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
  local_88.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
  local_88.data._M_elems[8] = local_138.data._M_elems[8];
  local_88.data._M_elems[9] = local_138.data._M_elems[9];
  local_88.data._M_elems[10] = local_138.data._M_elems[10];
  local_88.data._M_elems[0xb] = local_138.data._M_elems[0xb];
  local_88.data._M_elems[4] = local_138.data._M_elems[4];
  local_88.data._M_elems[5] = local_138.data._M_elems[5];
  local_88.data._M_elems[6] = local_138.data._M_elems[6];
  local_88.data._M_elems[7] = local_138.data._M_elems[7];
  local_88.data._M_elems[0] = local_138.data._M_elems[0];
  local_88.data._M_elems[1] = local_138.data._M_elems[1];
  local_88.data._M_elems[2] = local_138.data._M_elems[2];
  local_88.data._M_elems[3] = local_138.data._M_elems[3];
  local_88.exp = local_138.exp;
  local_88.neg = local_138.neg;
  local_88.fpclass = local_138.fpclass;
  local_88.prec_elem = local_138.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_88,&local_1a8);
  if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
    local_88.neg = (bool)(local_88.neg ^ 1);
  }
  puVar1 = (uint *)((long)local_e8[lVar14].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = local_88.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_88.data._M_elems[0xf]._1_3_,local_88.data._M_elems._56_5_)
  ;
  puVar1 = (uint *)((long)local_e8[lVar14].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar1 = local_88.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_88.data._M_elems._40_8_;
  puVar1 = (uint *)((long)local_e8[lVar14].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_88.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_88.data._M_elems._24_8_;
  *(undefined8 *)local_e8[lVar14].m_backend.data._M_elems = local_88.data._M_elems._0_8_;
  *(undefined8 *)((long)local_e8[lVar14].m_backend.data._M_elems + 8) = local_88.data._M_elems._8_8_
  ;
  local_e8[lVar14].m_backend.exp = local_88.exp;
  local_e8[lVar14].m_backend.neg = local_88.neg;
  local_e8[lVar14].m_backend.fpclass = local_88.fpclass;
  local_e8[lVar14].m_backend.prec_elem = local_88.prec_elem;
  if (1 < num) {
    local_140 = &(local_148->maxabs).m_backend;
    local_90 = (local_148->maxabs).m_backend.data._M_elems + 1;
    piVar15 = local_158 + lVar14;
    piVar12 = &local_e8[lVar14 + 1].m_backend.prec_elem;
    lVar14 = (ulong)(num - 2) + 1;
    do {
      piVar15 = piVar15 + 1;
      iVar7 = local_150[lVar14 + -1];
      *piVar15 = iVar7;
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 0x10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems[6] = 0;
      local_1a8.data._M_elems[7] = 0;
      local_1a8.data._M_elems[8] = 0;
      local_1a8.data._M_elems[9] = 0;
      local_1a8.data._M_elems[10] = 0;
      local_1a8.data._M_elems[0xb] = 0;
      local_1a8.data._M_elems[0xc] = 0;
      local_1a8.data._M_elems[0xd] = 0;
      local_1a8.data._M_elems._56_5_ = 0;
      local_1a8.data._M_elems[0xf]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      pcVar9 = &local_138;
      if (&local_1a8 != &local_e0[iVar7].m_backend) {
        local_1a8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
        local_1a8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
        local_1a8.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
        local_1a8.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
        local_1a8.data._M_elems[8] = local_138.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_138.data._M_elems[9];
        local_1a8.data._M_elems[10] = local_138.data._M_elems[10];
        local_1a8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
        local_1a8.data._M_elems[4] = local_138.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_138.data._M_elems[5];
        local_1a8.data._M_elems[6] = local_138.data._M_elems[6];
        local_1a8.data._M_elems[7] = local_138.data._M_elems[7];
        local_1a8.data._M_elems[0] = local_138.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_138.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_138.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_138.data._M_elems[3];
        local_1a8.exp = local_138.exp;
        local_1a8.neg = local_138.neg;
        local_1a8.fpclass = local_138.fpclass;
        local_1a8.prec_elem = local_138.prec_elem;
        pcVar9 = &local_e0[iVar7].m_backend;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_1a8,pcVar9)
      ;
      bVar10 = local_1a8.neg;
      uVar3 = local_1a8.data._M_elems[0];
      local_d8 = CONCAT44(local_1a8.data._M_elems[2],local_1a8.data._M_elems[1]);
      uStack_d0 = CONCAT44(local_1a8.data._M_elems[4],local_1a8.data._M_elems[3]);
      local_c8 = CONCAT44(local_1a8.data._M_elems[6],local_1a8.data._M_elems[5]);
      uStack_c0 = CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]);
      uStack_b8 = CONCAT44(local_1a8.data._M_elems[10],local_1a8.data._M_elems[9]);
      uStack_a4 = CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
      uStack_b0 = local_1a8.data._M_elems[0xb];
      local_ac = local_1a8.data._M_elems[0xc];
      uStack_a8 = local_1a8.data._M_elems[0xd];
      fVar4 = local_1a8.fpclass;
      iVar5 = local_1a8.prec_elem;
      (((cpp_dec_float<100U,_int,_void> *)(piVar12 + -0x13))->data)._M_elems[0] =
           local_1a8.data._M_elems[0];
      *(ulong *)(piVar12 + -7) = CONCAT44(local_1a8.data._M_elems[0xd],local_1a8.data._M_elems[0xc])
      ;
      *(undefined8 *)(piVar12 + -5) = uStack_a4;
      *(undefined8 *)(piVar12 + -10) = uStack_b8;
      *(ulong *)(piVar12 + -8) = CONCAT44(local_1a8.data._M_elems[0xc],local_1a8.data._M_elems[0xb])
      ;
      *(undefined8 *)(piVar12 + -0xe) = local_c8;
      *(undefined8 *)(piVar12 + -0xc) = uStack_c0;
      *(undefined8 *)(piVar12 + -0x12) = local_d8;
      *(undefined8 *)(piVar12 + -0x10) = uStack_d0;
      piVar12[-3] = local_1a8.exp;
      *(bool *)(piVar12 + -2) = local_1a8.neg;
      piVar12[-1] = local_1a8.fpclass;
      *piVar12 = local_1a8.prec_elem;
      if ((local_1a8.neg == true) &&
         (local_1a8.fpclass != cpp_dec_float_finite || local_1a8.data._M_elems[0] != 0)) {
        local_1a8.neg = false;
      }
      if ((local_1a8.fpclass != cpp_dec_float_NaN) &&
         ((local_148->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
        local_158 = (int *)CONCAT44(local_158._4_4_,local_1a8.exp);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_1a8,local_140);
        if (0 < iVar7) {
          if ((bool)bVar10 != false) {
            bVar10 = bVar10 ^ (fVar4 != cpp_dec_float_finite || uVar3 != 0);
          }
          (local_148->maxabs).m_backend.data._M_elems[0] = uVar3;
          *(ulong *)(local_90 + 0xb) = CONCAT44(uStack_a8,local_ac);
          *(undefined8 *)(local_90 + 0xd) = uStack_a4;
          *(undefined8 *)(local_90 + 8) = uStack_b8;
          *(ulong *)(local_90 + 10) = CONCAT44(local_ac,uStack_b0);
          *(undefined8 *)(local_90 + 4) = local_c8;
          *(undefined8 *)(local_90 + 6) = uStack_c0;
          *(undefined8 *)local_90 = local_d8;
          *(undefined8 *)(local_90 + 2) = uStack_d0;
          (local_148->maxabs).m_backend.exp = (int)local_158;
          (local_148->maxabs).m_backend.neg = (bool)bVar10;
          (local_148->maxabs).m_backend.fpclass = fVar4;
          (local_148->maxabs).m_backend.prec_elem = iVar5;
        }
      }
      piVar12 = piVar12 + 0x14;
      lVar11 = lVar14 + -1;
      bVar2 = 0 < lVar14;
      lVar14 = lVar11;
    } while (lVar11 != 0 && bVar2);
  }
  local_148->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}